

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall REPL::loop(REPL *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  time_t tVar4;
  istream *piVar5;
  ostream *poVar6;
  Position *other;
  int y;
  int x;
  Position pos;
  string command;
  string buffer;
  istringstream ss;
  Position local_208;
  Position local_200;
  AI *local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [16];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_1f8 = &this->ai;
  do {
    local_1d0 = local_1c0;
    local_1c8 = 0;
    local_1c0[0] = 0;
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x20);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_1d0,cVar2);
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_1d0,_S_in);
    local_1f0 = local_1e0;
    local_1e8 = 0;
    local_1e0[0] = 0;
    std::operator>>((istream *)local_1b0,(string *)&local_1f0);
    iVar3 = std::__cxx11::string::compare((char *)&local_1f0);
    if (iVar3 == 0) {
      tVar4 = time((time_t *)0x0);
      srand((uint)tVar4);
LAB_001026e6:
      bVar1 = true;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_1f0);
      if (iVar3 == 0) {
        piVar5 = (istream *)std::istream::operator>>((istream *)local_1b0,&local_200.x);
        piVar5 = (istream *)std::istream::operator>>(piVar5,&local_208.y);
        std::istream::operator>>(piVar5,&local_208.x);
        *(int *)(*(long *)&(this->board).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_200.x].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl +
                (long)local_208.y * 4) = local_208.x;
        goto LAB_001026e6;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_1f0);
      if (iVar3 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK",2);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
        std::ostream::put(-0x68);
        std::ostream::flush();
        goto LAB_001026e6;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_1f0);
      if (iVar3 == 0) {
        local_200 = AI::begin(local_1f8);
        *(undefined4 *)
         (*(long *)&(this->board).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_200.x].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl +
         ((long)local_200 >> 0x20) * 4) = 1;
        poVar6 = operator<<((ostream *)&std::cout,&local_200);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        goto LAB_001026e6;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_1f0);
      if (iVar3 == 0) {
        piVar5 = (istream *)std::istream::operator>>((istream *)local_1b0,&local_208.y);
        other = &local_208;
        std::istream::operator>>(piVar5,&local_208.x);
        *(undefined4 *)
         (*(long *)&(this->board).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_208.y].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl + (long)local_208.x * 4) =
             2;
        local_200 = AI::turn(local_1f8,other);
        *(undefined4 *)
         (*(long *)&(this->board).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_200.x].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl +
         ((long)local_200 >> 0x20) * 4) = 1;
        poVar6 = operator<<((ostream *)&std::cout,&local_200);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        goto LAB_001026e6;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_1f0);
      if (iVar3 != 0) goto LAB_001026e6;
      bVar1 = false;
    }
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0);
    }
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0);
    }
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void REPL::loop() {
    while (true) {
        string buffer;
        getline(cin, buffer);
        istringstream ss(buffer);

        string command;
        ss >> command;
        if (command == START) {
            ai.init();
        } else if (command == PLACE) {
            int x, y, z;
            ss >> x >> y >> z;
            board[x][y] = z;
        } else if (command == DONE) {
            cout << "OK" << endl;
        } else if (command == BEGIN) {
            Position pos = ai.begin();
            board[pos.x][pos.y] = ME;
            cout << pos << endl;
        } else if (command == TURN) {
            int x, y;
            ss >> x >> y;
            board[x][y] = OTHER;
            Position pos = ai.turn({x, y});
            board[pos.x][pos.y] = ME;
            cout << pos << endl;
        } else if (command == END) {
            break;
        }
    }
}